

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditPrivate::ensureVisible
          (QPlainTextEditPrivate *this,int position,bool center,bool forceCenter)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  QPlainTextEdit *pQVar6;
  ulong uVar7;
  byte in_CL;
  byte bVar8;
  byte in_DL;
  QTextEngine *extraout_RDX;
  undefined4 in_ESI;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  qreal qVar10;
  double dVar11;
  qreal voffset;
  int lineCount;
  int l;
  qreal h;
  qreal height;
  QPlainTextEdit *q;
  QRectF lineRect;
  QRectF lr;
  QTextLine line;
  QRectF br;
  QRectF visible;
  QTextBlock previousVisibleBlock;
  QTextBlock block;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  QRectF *in_stack_fffffffffffffd98;
  QRectF *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  byte bVar12;
  QPlainTextEditPrivate *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int local_214;
  double local_210;
  double local_208;
  undefined2 in_stack_fffffffffffffe08;
  undefined4 uVar13;
  QRectF local_1d8;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QRectF local_198 [2];
  QPointF local_158;
  QPointF local_148;
  QRectF local_118;
  undefined1 *local_f8;
  QTextEngine *local_f0;
  QRectF local_e8;
  QPointF local_c8;
  QPointF local_b8;
  QRect local_a8;
  QRectF local_78;
  QTextBlock local_48 [2];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = in_DL & 1;
  bVar1 = in_CL & 1;
  pQVar6 = q_func(in_RDI);
  local_78.xp = -NAN;
  local_78.yp = -NAN;
  local_78.w = -NAN;
  local_78.h = -NAN;
  local_a8 = QWidget::rect((QWidget *)
                           CONCAT17(in_stack_fffffffffffffdaf,
                                    CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)));
  QRectF::QRectF(in_stack_fffffffffffffda0,(QRect *)in_stack_fffffffffffffd98);
  local_c8 = QPlainTextEdit::contentOffset
                       ((QPlainTextEdit *)
                        CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)));
  local_b8 = ::operator-((QPointF *)in_stack_fffffffffffffd98);
  QRectF::translated((QRectF *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (QPointF *)in_stack_fffffffffffffdb8);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document
            ((QWidgetTextControl *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  QTextDocument::findBlock((int)local_18);
  uVar7 = QTextBlock::isValid();
  if ((uVar7 & 1) == 0) goto LAB_006c1d7f;
  local_e8.xp = -NAN;
  local_e8.yp = -NAN;
  local_e8.w = -NAN;
  local_e8.h = -NAN;
  (**(code **)(*(long *)&in_RDI->control->super_QWidgetTextControl + 0x80))
            (&local_e8,in_RDI->control,local_18);
  bVar2 = QRectF::isValid(&local_e8);
  if (!bVar2) goto LAB_006c1d7f;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = QTextBlock::layout();
  uVar13 = in_ESI;
  QTextBlock::position();
  iVar3 = QTextLayout::lineForTextPosition(iVar3);
  local_f8 = (undefined1 *)CONCAT44(local_f8._4_4_,iVar3);
  local_118.xp = -NAN;
  local_118.yp = -NAN;
  local_118.w = -NAN;
  local_118.h = -NAN;
  local_f0 = extraout_RDX;
  QTextLine::naturalTextRect();
  local_148 = QRectF::topLeft(in_stack_fffffffffffffd98);
  QRectF::translated((QRectF *)CONCAT44(in_ESI,in_stack_fffffffffffffdc0),
                     (QPointF *)in_stack_fffffffffffffdb8);
  qVar9 = QRectF::bottom(&local_118);
  qVar10 = QRectF::bottom(&local_78);
  if (qVar9 < qVar10) {
    if ((bVar8 & 1) != 0) {
      in_stack_fffffffffffffdb8 = (QPlainTextEditPrivate *)QRectF::top(&local_118);
      qVar9 = QRectF::top(&local_78);
      if ((double)in_stack_fffffffffffffdb8 < qVar9) goto LAB_006c19d0;
    }
    iVar3 = (int)((ulong)pQVar6 >> 0x20);
    if ((bVar1 & 1) == 0) {
      qVar9 = QRectF::top(&local_118);
      qVar10 = QRectF::top(&local_78);
      if (qVar9 < qVar10) {
        QTextBlock::blockNumber();
        QTextLine::lineNumber((QTextLine *)&local_f8);
        setTopBlock((QPlainTextEditPrivate *)
                    CONCAT44(uVar13,CONCAT13(bVar8,CONCAT12(bVar1,in_stack_fffffffffffffe08))),
                    in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,iVar3);
      }
      goto LAB_006c1d7f;
    }
  }
LAB_006c19d0:
  local_208 = QRectF::height(&local_78);
  if ((bVar8 & 1) != 0) {
    local_208 = local_208 / 2.0;
  }
  if ((bVar8 & 1) == 0) {
    QTextLine::naturalTextRect();
    local_210 = QRectF::bottom(local_198);
  }
  else {
    QTextLine::naturalTextRect();
    local_158 = QRectF::center(in_stack_fffffffffffffd98);
    local_210 = QPointF::y(&local_158);
  }
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  qVar9 = local_210;
  QTextBlock::QTextBlock((QTextBlock *)local_28,(QTextBlock *)local_18);
  while( true ) {
    bVar12 = 0;
    if (local_210 < local_208) {
      QTextBlock::previous();
      bVar12 = QTextBlock::isValid();
    }
    if ((bVar12 & 1) == 0) break;
    QTextBlock::operator=((QTextBlock *)local_28,(QTextBlock *)local_18);
    do {
      QTextBlock::previous();
      QTextBlock::operator=((QTextBlock *)local_18,local_48);
      uVar4 = QTextBlock::isVisible();
      bVar12 = 0;
      if ((uVar4 & 1) == 0) {
        QTextBlock::previous();
        bVar12 = QTextBlock::isValid();
      }
    } while ((bVar12 & 1) != 0);
    QPlainTextEdit::blockBoundingRect
              ((QPlainTextEdit *)in_stack_fffffffffffffda0,(QTextBlock *)in_stack_fffffffffffffd98);
    qVar10 = QRectF::height((QRectF *)&stack0xfffffffffffffe48);
    local_210 = qVar10 + local_210;
  }
  local_214 = 0;
  QTextBlock::layout();
  iVar3 = QTextLayout::lineCount();
  QTextBlock::blockNumber();
  qVar9 = verticalOffset(in_stack_fffffffffffffdb8,(int)((ulong)qVar9 >> 0x20),SUB84(qVar9,0));
  for (; iVar5 = (int)((ulong)pQVar6 >> 0x20), local_214 < iVar3; local_214 = local_214 + 1) {
    local_1d8.xp = -NAN;
    local_1d8.yp = -NAN;
    local_1d8.w = -NAN;
    local_1d8.h = -NAN;
    iVar5 = QTextBlock::layout();
    QTextLayout::lineAt(iVar5);
    QTextLine::naturalTextRect();
    dVar11 = local_210 - qVar9;
    qVar10 = QRectF::top(&local_1d8);
    iVar5 = (int)((ulong)pQVar6 >> 0x20);
    if (dVar11 - qVar10 <= local_208) break;
  }
  if (iVar3 <= local_214) {
    QTextBlock::operator=((QTextBlock *)local_18,(QTextBlock *)local_28);
  }
  QTextBlock::blockNumber();
  setTopBlock((QPlainTextEditPrivate *)
              CONCAT44(uVar13,CONCAT13(bVar8,CONCAT12(bVar1,in_stack_fffffffffffffe08))),
              in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,iVar5);
LAB_006c1d7f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::ensureVisible(int position, bool center, bool forceCenter) {
    Q_Q(QPlainTextEdit);
    QRectF visible = QRectF(viewport->rect()).translated(-q->contentOffset());
    QTextBlock block = control->document()->findBlock(position);
    if (!block.isValid())
        return;
    QRectF br = control->blockBoundingRect(block);
    if (!br.isValid())
        return;
    QTextLine line = block.layout()->lineForTextPosition(position - block.position());
    Q_ASSERT(line.isValid());
    QRectF lr = line.naturalTextRect().translated(br.topLeft());

    if (lr.bottom() >= visible.bottom() || (center && lr.top() < visible.top()) || forceCenter){

        qreal height = visible.height();
        if (center)
            height /= 2;

        qreal h = center ? line.naturalTextRect().center().y() : line.naturalTextRect().bottom();

        QTextBlock previousVisibleBlock = block;
        while (h < height && block.previous().isValid()) {
            previousVisibleBlock = block;
            do {
                block = block.previous();
            } while (!block.isVisible() && block.previous().isValid());
            h += q->blockBoundingRect(block).height();
        }

        int l = 0;
        int lineCount = block.layout()->lineCount();
        qreal voffset = verticalOffset(block.blockNumber(), 0);
        while (l < lineCount) {
            QRectF lineRect = block.layout()->lineAt(l).naturalTextRect();
            if (h - voffset - lineRect.top() <= height)
                break;
            ++l;
        }

        if (l >= lineCount) {
            block = previousVisibleBlock;
            l = 0;
        }
        setTopBlock(block.blockNumber(), l);
    } else if (lr.top() < visible.top()) {
        setTopBlock(block.blockNumber(), line.lineNumber());
    }

}